

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3CreateIndex(Parse *pParse,Token *pName1,Token *pName2,SrcList *pTblName,ExprList *pList,
                       int onError,Token *pStart,Expr *pPIWhere,int sortOrder,int ifNotExist,
                       u8 idxType)

{
  short sVar1;
  i16 iVar2;
  int iVar3;
  int iVar4;
  Table *pTVar5;
  Index *pIVar6;
  i16 *piVar7;
  Expr *pEVar8;
  CollSeq *pCVar9;
  void *pvVar10;
  Vdbe *p_00;
  char *pcVar11;
  bool bVar12;
  uint local_184;
  LogEst *local_178;
  Index *pOther;
  int n_1;
  int iMem;
  char *zStmt;
  Vdbe *v;
  Index *p;
  char *z2;
  char *z1;
  LogEst *pLStack_138;
  int k;
  Index *pIdx;
  int x;
  int nColl;
  char *zColl;
  int requestedSortOrder;
  Expr *pCExpr;
  Expr *pExpr;
  Column *pCol;
  Token prevCol;
  char *zDb;
  Index *pLoop;
  Index *pIStack_d8;
  int n;
  Index *pPk;
  char *zExtra;
  int nExtraCol;
  int nExtra;
  ExprList_item *pListItem;
  Token *pName;
  char *pcStack_a8;
  int iDb;
  Db *pDb;
  sqlite3 *db;
  undefined1 local_90 [4];
  int sortOrderMask;
  DbFixer sFix;
  int local_58;
  int j;
  int i;
  int nName;
  char *zName;
  Index *pIndex;
  Table *pTab;
  ExprList *pEStack_30;
  int onError_local;
  ExprList *pList_local;
  SrcList *pTblName_local;
  Token *pName2_local;
  Token *pName1_local;
  Parse *pParse_local;
  
  zName = (char *)0x0;
  _i = (char *)0x0;
  pDb = (Db *)pParse->db;
  pListItem = (ExprList_item *)0x0;
  zExtra._4_4_ = 0;
  pPk = (Index *)0x0;
  pIStack_d8 = (Index *)0x0;
  pEStack_30 = pList;
  if ((((((sqlite3 *)pDb)->mallocFailed != '\0') || (0 < pParse->nErr)) ||
      ((pParse->eParseMode == '\x01' && (idxType != '\x02')))) ||
     (iVar3 = sqlite3ReadSchema(pParse), iVar3 != 0)) goto LAB_0019d0e5;
  if (pTblName == (SrcList *)0x0) {
    pIndex = (Index *)pParse->pNewTable;
    if (pIndex == (Index *)0x0) goto LAB_0019d0e5;
    pName._4_4_ = sqlite3SchemaToIndex((sqlite3 *)pDb,(Schema *)pIndex->aAvgEq);
  }
  else {
    pName._4_4_ = sqlite3TwoPartName(pParse,pName1,pName2,(Token **)&pListItem);
    if (pName._4_4_ < 0) goto LAB_0019d0e5;
    if ((((pDb[5].field_0x15 == '\0') &&
         (pTVar5 = sqlite3SrcListLookup(pParse,pTblName), pName2->n == 0)) &&
        (pTVar5 != (Table *)0x0)) && (pTVar5->pSchema == *(Schema **)(pDb[1].zDbSName + 0x38))) {
      pName._4_4_ = 1;
    }
    sqlite3FixInit((DbFixer *)local_90,pParse,pName._4_4_,"index",(Token *)pListItem);
    sqlite3FixSrcList((DbFixer *)local_90,pTblName);
    pIndex = (Index *)sqlite3LocateTableItem(pParse,0,pTblName->a);
    if (pIndex == (Index *)0x0) goto LAB_0019d0e5;
    if ((pName._4_4_ == 1) && (*(Schema **)(pDb[1].zDbSName + 0x38) != (Schema *)pIndex->aAvgEq)) {
      sqlite3ErrorMsg(pParse,"cannot create a TEMP index on non-TEMP table \"%s\"",pIndex->zName);
      goto LAB_0019d0e5;
    }
    if (((ulong)pIndex->azColl & 0x20) != 0) {
      pIStack_d8 = sqlite3PrimaryKeyIndex((Table *)pIndex);
    }
  }
  pcStack_a8 = pDb[1].zDbSName + (long)pName._4_4_ * 0x20;
  iVar3 = sqlite3_strnicmp(pIndex->zName,"sqlite_",7);
  if (((iVar3 == 0) && (pDb[5].field_0x15 == '\0')) && (pTblName != (SrcList *)0x0)) {
    sqlite3ErrorMsg(pParse,"table %s may not be indexed",pIndex->zName);
  }
  else if (pIndex->pTable == (Table *)0x0) {
    if (*(int *)((long)&pIndex->aColExpr + 4) == 0) {
      if (pListItem == (ExprList_item *)0x0) {
        zDb = (char *)pIndex->aiRowLogEst;
        pLoop._4_4_ = 1;
        for (; zDb != (char *)0x0; zDb = *(char **)(zDb + 0x28)) {
          pLoop._4_4_ = pLoop._4_4_ + 1;
        }
        _i = sqlite3MPrintf((sqlite3 *)pDb,"sqlite_autoindex_%s_%d",pIndex->zName,(ulong)pLoop._4_4_
                           );
        if (_i == (char *)0x0) goto LAB_0019d0e5;
        if (pParse->eParseMode != '\0') {
          _i[7] = _i[7] + '\x01';
        }
      }
      else {
        _i = sqlite3NameFromToken((sqlite3 *)pDb,(Token *)pListItem);
        if ((_i == (char *)0x0) || (iVar3 = sqlite3CheckObjectName(pParse,_i), iVar3 != 0))
        goto LAB_0019d0e5;
        if (pParse->eParseMode < 2) {
          if ((pDb[5].field_0x15 == '\0') &&
             (pTVar5 = sqlite3FindTable((sqlite3 *)pDb,_i,(char *)0x0), pTVar5 != (Table *)0x0)) {
            sqlite3ErrorMsg(pParse,"there is already a table named %s",_i);
            goto LAB_0019d0e5;
          }
          pIVar6 = sqlite3FindIndex((sqlite3 *)pDb,_i,*(char **)pcStack_a8);
          if (pIVar6 != (Index *)0x0) {
            if (ifNotExist == 0) {
              sqlite3ErrorMsg(pParse,"index %s already exists",_i);
            }
            else {
              sqlite3CodeVerifySchema(pParse,pName._4_4_);
            }
            goto LAB_0019d0e5;
          }
        }
      }
      if (pParse->eParseMode < 2) {
        prevCol._8_8_ = *(undefined8 *)pcStack_a8;
        pcVar11 = "sqlite_master";
        if (pName._4_4_ == 1) {
          pcVar11 = "sqlite_temp_master";
        }
        iVar3 = sqlite3AuthCheck(pParse,0x12,pcVar11,(char *)0x0,(char *)prevCol._8_8_);
        if (iVar3 != 0) goto LAB_0019d0e5;
        local_58 = 1;
        if (pName._4_4_ == 1) {
          local_58 = 3;
        }
        iVar3 = sqlite3AuthCheck(pParse,local_58,_i,pIndex->zName,(char *)prevCol._8_8_);
        if (iVar3 != 0) goto LAB_0019d0e5;
      }
      if (pList == (ExprList *)0x0) {
        piVar7 = pIndex->aiColumn + (long)(*(short *)((long)&pIndex->azColl + 6) + -1) * 0x10;
        *(byte *)((long)piVar7 + 0x1b) = *(byte *)((long)piVar7 + 0x1b) | 8;
        sqlite3TokenInit((Token *)&pCol,*(char **)piVar7);
        pEVar8 = sqlite3ExprAlloc((sqlite3 *)pDb,0x3b,(Token *)&pCol,0);
        pEStack_30 = sqlite3ExprListAppend(pParse,(ExprList *)0x0,pEVar8);
        if (pEStack_30 == (ExprList *)0x0) goto LAB_0019d0e5;
        sqlite3ExprListSetSortOrder(pEStack_30,sortOrder);
      }
      else {
        sqlite3ExprListCheckLength(pParse,pList,"index");
        if (pParse->nErr != 0) goto LAB_0019d0e5;
      }
      for (local_58 = 0; local_58 < pEStack_30->nExpr; local_58 = local_58 + 1) {
        pEVar8 = pEStack_30->a[local_58].pExpr;
        if (pEVar8->op == 'j') {
          iVar3 = sqlite3Strlen30((pEVar8->u).zToken);
          zExtra._4_4_ = iVar3 + 1 + zExtra._4_4_;
        }
      }
      iVar3 = sqlite3Strlen30(_i);
      if (pIStack_d8 == (Index *)0x0) {
        local_184 = 1;
      }
      else {
        local_184 = (uint)pIStack_d8->nKeyCol;
      }
      zExtra._0_4_ = local_184;
      zName = (char *)sqlite3AllocateIndexObject
                                ((sqlite3 *)pDb,(short)pEStack_30->nExpr + (short)local_184,
                                 iVar3 + zExtra._4_4_ + 1,(char **)&pPk);
      if (*(char *)((long)&pDb[3].zDbSName + 1) == '\0') {
        ((Index *)zName)->zName = (char *)pPk;
        pPk = (Index *)((long)&pPk->zName + (long)(iVar3 + 1));
        memcpy(((Index *)zName)->zName,_i,(long)(iVar3 + 1));
        ((Index *)zName)->pTable = (Table *)pIndex;
        ((Index *)zName)->onError = (u8)onError;
        *(ushort *)&((Index *)zName)->field_0x63 =
             *(ushort *)&((Index *)zName)->field_0x63 & 0xfff7 | (ushort)(onError != 0) << 3;
        *(ushort *)&((Index *)zName)->field_0x63 =
             *(ushort *)&((Index *)zName)->field_0x63 & 0xfffc | idxType & 3;
        ((Index *)zName)->pSchema = *(Schema **)(pDb[1].zDbSName + (long)pName._4_4_ * 0x20 + 0x18);
        ((Index *)zName)->nKeyCol = (u16)pEStack_30->nExpr;
        if (pPIWhere != (Expr *)0x0) {
          sqlite3ResolveSelfReference(pParse,(Table *)pIndex,2,pPIWhere,(ExprList *)0x0);
          ((Index *)zName)->pPartIdxWhere = pPIWhere;
          pPIWhere = (Expr *)0x0;
        }
        if (*(byte *)(*(long *)(pcStack_a8 + 0x18) + 0x70) < 4) {
          db._4_4_ = 0;
        }
        else {
          db._4_4_ = 0xffffffff;
        }
        _nExtraCol = pEStack_30->a;
        if (1 < pParse->eParseMode) {
          ((Index *)zName)->aColExpr = pEStack_30;
          pEStack_30 = (ExprList *)0x0;
        }
        for (local_58 = 0; local_58 < (int)(uint)((Index *)zName)->nKeyCol; local_58 = local_58 + 1)
        {
          sqlite3StringToId(_nExtraCol->pExpr);
          sqlite3ResolveSelfReference(pParse,(Table *)pIndex,0x20,_nExtraCol->pExpr,(ExprList *)0x0)
          ;
          if (pParse->nErr != 0) goto LAB_0019d0e5;
          pEVar8 = sqlite3ExprSkipCollate(_nExtraCol->pExpr);
          if (pEVar8->op == 0xa2) {
            sFix.pName._4_4_ = (int)pEVar8->iColumn;
            if (sFix.pName._4_4_ < 0) {
              sFix.pName._4_4_ = (int)*(short *)((long)&pIndex->azColl + 4);
            }
            else if ((char)pIndex->aiColumn[(long)sFix.pName._4_4_ * 0x10 + 0xc] == '\0') {
              *(ushort *)&((Index *)zName)->field_0x63 =
                   *(ushort *)&((Index *)zName)->field_0x63 & 0xfff7;
            }
            ((Index *)zName)->aiColumn[local_58] = (i16)sFix.pName._4_4_;
          }
          else {
            if (pIndex == (Index *)pParse->pNewTable) {
              sqlite3ErrorMsg(pParse,"expressions prohibited in PRIMARY KEY and UNIQUE constraints")
              ;
              goto LAB_0019d0e5;
            }
            if (((Index *)zName)->aColExpr == (ExprList *)0x0) {
              ((Index *)zName)->aColExpr = pEStack_30;
              pEStack_30 = (ExprList *)0x0;
            }
            sFix.pName._4_4_ = -2;
            ((Index *)zName)->aiColumn[local_58] = -2;
            *(ushort *)&((Index *)zName)->field_0x63 =
                 *(ushort *)&((Index *)zName)->field_0x63 & 0xfff7;
          }
          _x = (char *)0x0;
          if (_nExtraCol->pExpr->op == 'j') {
            pcVar11 = (_nExtraCol->pExpr->u).zToken;
            iVar3 = sqlite3Strlen30(pcVar11);
            iVar3 = iVar3 + 1;
            memcpy(pPk,pcVar11,(long)iVar3);
            _x = (char *)pPk;
            pPk = (Index *)((long)&pPk->zName + (long)iVar3);
            zExtra._4_4_ = zExtra._4_4_ - iVar3;
          }
          else if (-1 < sFix.pName._4_4_) {
            _x = *(char **)(pIndex->aiColumn + (long)sFix.pName._4_4_ * 0x10 + 8);
          }
          if ((Index *)_x == (Index *)0x0) {
            _x = "BINARY";
          }
          if ((pDb[5].field_0x15 == '\0') &&
             (pCVar9 = sqlite3LocateCollSeq(pParse,_x), pCVar9 == (CollSeq *)0x0))
          goto LAB_0019d0e5;
          ((Index *)zName)->azColl[local_58] = _x;
          ((Index *)zName)->aSortOrder[local_58] = _nExtraCol->sortOrder & (byte)db._4_4_;
          _nExtraCol = _nExtraCol + 1;
        }
        if (pIStack_d8 == (Index *)0x0) {
          ((Index *)zName)->aiColumn[local_58] = -1;
          ((Index *)zName)->azColl[local_58] = "BINARY";
        }
        else {
          for (sFix.pName._4_4_ = 0; sFix.pName._4_4_ < (int)(uint)pIStack_d8->nKeyCol;
              sFix.pName._4_4_ = sFix.pName._4_4_ + 1) {
            sVar1 = pIStack_d8->aiColumn[sFix.pName._4_4_];
            iVar3 = hasColumn(((Index *)zName)->aiColumn,(uint)((Index *)zName)->nKeyCol,(int)sVar1)
            ;
            if (iVar3 == 0) {
              ((Index *)zName)->aiColumn[local_58] = sVar1;
              ((Index *)zName)->azColl[local_58] = pIStack_d8->azColl[sFix.pName._4_4_];
              ((Index *)zName)->aSortOrder[local_58] = pIStack_d8->aSortOrder[sFix.pName._4_4_];
              local_58 = local_58 + 1;
            }
            else {
              ((Index *)zName)->nColumn = ((Index *)zName)->nColumn - 1;
            }
          }
        }
        sqlite3DefaultRowEst((Index *)zName);
        if (pParse->pNewTable == (Table *)0x0) {
          estimateIndexWidth((Index *)zName);
        }
        recomputeColumnsNotIndexed((Index *)zName);
        if ((pTblName != (SrcList *)0x0) &&
           ((int)*(short *)((long)&pIndex->azColl + 6) <= (int)(uint)((Index *)zName)->nColumn)) {
          *(ushort *)&((Index *)zName)->field_0x63 =
               *(ushort *)&((Index *)zName)->field_0x63 & 0xffdf | 0x20;
          for (sFix.pName._4_4_ = 0; sFix.pName._4_4_ < *(short *)((long)&pIndex->azColl + 6);
              sFix.pName._4_4_ = sFix.pName._4_4_ + 1) {
            if ((sFix.pName._4_4_ != *(short *)((long)&pIndex->azColl + 4)) &&
               (iVar2 = sqlite3ColumnOfIndex((Index *)zName,(i16)sFix.pName._4_4_), iVar2 < 0)) {
              *(ushort *)&((Index *)zName)->field_0x63 =
                   *(ushort *)&((Index *)zName)->field_0x63 & 0xffdf;
              break;
            }
          }
        }
        if (pIndex == (Index *)pParse->pNewTable) {
          for (pLStack_138 = pIndex->aiRowLogEst; pLStack_138 != (LogEst *)0x0;
              pLStack_138 = *(LogEst **)(pLStack_138 + 0x14)) {
            if (pLStack_138[0x2f] == ((Index *)zName)->nKeyCol) {
              z1._4_4_ = 0;
              while ((((int)z1._4_4_ < (int)(uint)(ushort)pLStack_138[0x2f] &&
                      (*(short *)(*(long *)(pLStack_138 + 4) + (long)(int)z1._4_4_ * 2) ==
                       ((Index *)zName)->aiColumn[(int)z1._4_4_])) &&
                     (iVar3 = sqlite3StrICmp(*(char **)(*(long *)(pLStack_138 + 0x20) +
                                                       (long)(int)z1._4_4_ * 8),
                                             ((Index *)zName)->azColl[(int)z1._4_4_]), iVar3 == 0)))
              {
                z1._4_4_ = z1._4_4_ + 1;
              }
              if (z1._4_4_ == (ushort)pLStack_138[0x2f]) {
                if ((u8)pLStack_138[0x31] != ((Index *)zName)->onError) {
                  if (((char)pLStack_138[0x31] != '\v') && (((Index *)zName)->onError != '\v')) {
                    sqlite3ErrorMsg(pParse,"conflicting ON CONFLICT clauses specified",0);
                  }
                  if ((char)pLStack_138[0x31] == '\v') {
                    *(u8 *)(pLStack_138 + 0x31) = ((Index *)zName)->onError;
                  }
                }
                if (idxType == '\x02') {
                  *(ushort *)((long)pLStack_138 + 99) =
                       *(ushort *)((long)pLStack_138 + 99) & 0xfffc | 2;
                }
                if (1 < pParse->eParseMode) {
                  ((Index *)zName)->pNext = pParse->pNewIndex;
                  pParse->pNewIndex = (Index *)zName;
                  zName = (char *)0x0;
                }
                goto LAB_0019d0e5;
              }
            }
          }
        }
        if (pParse->eParseMode < 2) {
          if (pDb[5].field_0x15 == '\0') {
            if ((((ulong)pIndex->azColl & 0x20) == 0) || (pTblName != (SrcList *)0x0)) {
              iVar3 = pParse->nMem + 1;
              pParse->nMem = iVar3;
              p_00 = sqlite3GetVdbe(pParse);
              if (p_00 == (Vdbe *)0x0) goto LAB_0019d0e5;
              sqlite3BeginWriteOperation(pParse,1,pName._4_4_);
              iVar4 = sqlite3VdbeAddOp0(p_00,0xaa);
              ((Index *)zName)->tnum = iVar4;
              sqlite3VdbeAddOp3(p_00,0x8b,pName._4_4_,iVar3,2);
              if (pStart == (Token *)0x0) {
                _n_1 = (char *)0x0;
              }
              else {
                pOther._0_4_ = ((int)(pParse->sLastToken).z - (int)pListItem->pExpr) +
                               (pParse->sLastToken).n;
                if ((&pListItem->pExpr->op)[(int)((uint)pOther - 1)] == ';') {
                  pOther._0_4_ = (uint)pOther - 1;
                }
                pcVar11 = " UNIQUE";
                if (onError == 0) {
                  pcVar11 = "";
                }
                _n_1 = sqlite3MPrintf((sqlite3 *)pDb,"CREATE%s INDEX %.*s",pcVar11,
                                      (ulong)(uint)pOther,pListItem->pExpr);
              }
              sqlite3NestedParse(pParse,"INSERT INTO %Q.%s VALUES(\'index\',%Q,%Q,#%d,%Q);",
                                 *(undefined8 *)(pDb[1].zDbSName + (long)pName._4_4_ * 0x20),
                                 "sqlite_master",((Index *)zName)->zName,pIndex->zName,iVar3,_n_1);
              sqlite3DbFree((sqlite3 *)pDb,_n_1);
              if (pTblName != (SrcList *)0x0) {
                sqlite3RefillIndex(pParse,(Index *)zName,iVar3);
                sqlite3ChangeCookie(pParse,pName._4_4_);
                iVar3 = pName._4_4_;
                pcVar11 = sqlite3MPrintf((sqlite3 *)pDb,"name=\'%q\' AND type=\'index\'",
                                         ((Index *)zName)->zName);
                sqlite3VdbeAddParseSchemaOp(p_00,iVar3,pcVar11);
                sqlite3VdbeAddOp2(p_00,0x9e,0,1);
              }
              sqlite3VdbeJumpHere(p_00,((Index *)zName)->tnum);
            }
          }
          else {
            if (pTblName != (SrcList *)0x0) {
              ((Index *)zName)->tnum = *(int *)&pDb[5].safety_level;
              iVar3 = sqlite3IndexHasDuplicateRootPage((Index *)zName);
              if (iVar3 != 0) {
                sqlite3ErrorMsg(pParse,"invalid rootpage");
                iVar3 = sqlite3CorruptError(0x1af0d);
                pParse->rc = iVar3;
                goto LAB_0019d0e5;
              }
            }
            pvVar10 = sqlite3HashInsert(&((Index *)zName)->pSchema->idxHash,((Index *)zName)->zName,
                                        zName);
            if (pvVar10 != (void *)0x0) {
              sqlite3OomFault((sqlite3 *)pDb);
              goto LAB_0019d0e5;
            }
            *(uint *)((long)&pDb[1].pBt + 4) = *(uint *)((long)&pDb[1].pBt + 4) | 1;
          }
        }
        if ((pDb[5].field_0x15 == '\0') && (pTblName != (SrcList *)0x0)) {
          if (1 < pParse->eParseMode) {
            pParse->pNewIndex = (Index *)zName;
            zName = (char *)0x0;
          }
        }
        else {
          if ((onError == 5) &&
             ((pIndex->aiRowLogEst != (LogEst *)0x0 && ((char)pIndex->aiRowLogEst[0x31] != '\x05')))
             ) {
            local_178 = pIndex->aiRowLogEst;
            while( true ) {
              bVar12 = false;
              if (*(long *)(local_178 + 0x14) != 0) {
                bVar12 = *(char *)(*(long *)(local_178 + 0x14) + 0x62) != '\x05';
              }
              if (!bVar12) break;
              local_178 = *(LogEst **)(local_178 + 0x14);
            }
            ((Index *)zName)->pNext = *(Index **)(local_178 + 0x14);
            *(char **)(local_178 + 0x14) = zName;
          }
          else {
            ((Index *)zName)->pNext = (Index *)pIndex->aiRowLogEst;
            pIndex->aiRowLogEst = (LogEst *)zName;
          }
          zName = (char *)0x0;
        }
      }
    }
    else {
      sqlite3ErrorMsg(pParse,"virtual tables may not be indexed");
    }
  }
  else {
    sqlite3ErrorMsg(pParse,"views may not be indexed");
  }
LAB_0019d0e5:
  if (zName != (char *)0x0) {
    sqlite3FreeIndex((sqlite3 *)pDb,(Index *)zName);
  }
  sqlite3ExprDelete((sqlite3 *)pDb,pPIWhere);
  sqlite3ExprListDelete((sqlite3 *)pDb,pEStack_30);
  sqlite3SrcListDelete((sqlite3 *)pDb,pTblName);
  sqlite3DbFree((sqlite3 *)pDb,_i);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateIndex(
  Parse *pParse,     /* All information about this parse */
  Token *pName1,     /* First part of index name. May be NULL */
  Token *pName2,     /* Second part of index name. May be NULL */
  SrcList *pTblName, /* Table to index. Use pParse->pNewTable if 0 */
  ExprList *pList,   /* A list of columns to be indexed */
  int onError,       /* OE_Abort, OE_Ignore, OE_Replace, or OE_None */
  Token *pStart,     /* The CREATE token that begins this statement */
  Expr *pPIWhere,    /* WHERE clause for partial indices */
  int sortOrder,     /* Sort order of primary key when pList==NULL */
  int ifNotExist,    /* Omit error if index already exists */
  u8 idxType         /* The index type */
){
  Table *pTab = 0;     /* Table to be indexed */
  Index *pIndex = 0;   /* The index to be created */
  char *zName = 0;     /* Name of the index */
  int nName;           /* Number of characters in zName */
  int i, j;
  DbFixer sFix;        /* For assigning database names to pTable */
  int sortOrderMask;   /* 1 to honor DESC in index.  0 to ignore. */
  sqlite3 *db = pParse->db;
  Db *pDb;             /* The specific table containing the indexed database */
  int iDb;             /* Index of the database that is being written */
  Token *pName = 0;    /* Unqualified name of the index to create */
  struct ExprList_item *pListItem; /* For looping over pList */
  int nExtra = 0;                  /* Space allocated for zExtra[] */
  int nExtraCol;                   /* Number of extra columns needed */
  char *zExtra = 0;                /* Extra space after the Index object */
  Index *pPk = 0;      /* PRIMARY KEY index for WITHOUT ROWID tables */

  if( db->mallocFailed || pParse->nErr>0 ){
    goto exit_create_index;
  }
  if( IN_DECLARE_VTAB && idxType!=SQLITE_IDXTYPE_PRIMARYKEY ){
    goto exit_create_index;
  }
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    goto exit_create_index;
  }

  /*
  ** Find the table that is to be indexed.  Return early if not found.
  */
  if( pTblName!=0 ){

    /* Use the two-part index name to determine the database 
    ** to search for the table. 'Fix' the table name to this db
    ** before looking up the table.
    */
    assert( pName1 && pName2 );
    iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pName);
    if( iDb<0 ) goto exit_create_index;
    assert( pName && pName->z );

#ifndef SQLITE_OMIT_TEMPDB
    /* If the index name was unqualified, check if the table
    ** is a temp table. If so, set the database to 1. Do not do this
    ** if initialising a database schema.
    */
    if( !db->init.busy ){
      pTab = sqlite3SrcListLookup(pParse, pTblName);
      if( pName2->n==0 && pTab && pTab->pSchema==db->aDb[1].pSchema ){
        iDb = 1;
      }
    }
#endif

    sqlite3FixInit(&sFix, pParse, iDb, "index", pName);
    if( sqlite3FixSrcList(&sFix, pTblName) ){
      /* Because the parser constructs pTblName from a single identifier,
      ** sqlite3FixSrcList can never fail. */
      assert(0);
    }
    pTab = sqlite3LocateTableItem(pParse, 0, &pTblName->a[0]);
    assert( db->mallocFailed==0 || pTab==0 );
    if( pTab==0 ) goto exit_create_index;
    if( iDb==1 && db->aDb[iDb].pSchema!=pTab->pSchema ){
      sqlite3ErrorMsg(pParse, 
           "cannot create a TEMP index on non-TEMP table \"%s\"",
           pTab->zName);
      goto exit_create_index;
    }
    if( !HasRowid(pTab) ) pPk = sqlite3PrimaryKeyIndex(pTab);
  }else{
    assert( pName==0 );
    assert( pStart==0 );
    pTab = pParse->pNewTable;
    if( !pTab ) goto exit_create_index;
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  }
  pDb = &db->aDb[iDb];

  assert( pTab!=0 );
  assert( pParse->nErr==0 );
  if( sqlite3StrNICmp(pTab->zName, "sqlite_", 7)==0 
       && db->init.busy==0
       && pTblName!=0
#if SQLITE_USER_AUTHENTICATION
       && sqlite3UserAuthTable(pTab->zName)==0
#endif
#ifdef SQLITE_ALLOW_SQLITE_MASTER_INDEX
       && sqlite3StrICmp(&pTab->zName[7],"master")!=0
#endif
 ){
    sqlite3ErrorMsg(pParse, "table %s may not be indexed", pTab->zName);
    goto exit_create_index;
  }
#ifndef SQLITE_OMIT_VIEW
  if( pTab->pSelect ){
    sqlite3ErrorMsg(pParse, "views may not be indexed");
    goto exit_create_index;
  }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    sqlite3ErrorMsg(pParse, "virtual tables may not be indexed");
    goto exit_create_index;
  }
#endif

  /*
  ** Find the name of the index.  Make sure there is not already another
  ** index or table with the same name.  
  **
  ** Exception:  If we are reading the names of permanent indices from the
  ** sqlite_master table (because some other process changed the schema) and
  ** one of the index names collides with the name of a temporary table or
  ** index, then we will continue to process this index.
  **
  ** If pName==0 it means that we are
  ** dealing with a primary key or UNIQUE constraint.  We have to invent our
  ** own name.
  */
  if( pName ){
    zName = sqlite3NameFromToken(db, pName);
    if( zName==0 ) goto exit_create_index;
    assert( pName->z!=0 );
    if( SQLITE_OK!=sqlite3CheckObjectName(pParse, zName) ){
      goto exit_create_index;
    }
    if( !IN_RENAME_OBJECT ){
      if( !db->init.busy ){
        if( sqlite3FindTable(db, zName, 0)!=0 ){
          sqlite3ErrorMsg(pParse, "there is already a table named %s", zName);
          goto exit_create_index;
        }
      }
      if( sqlite3FindIndex(db, zName, pDb->zDbSName)!=0 ){
        if( !ifNotExist ){
          sqlite3ErrorMsg(pParse, "index %s already exists", zName);
        }else{
          assert( !db->init.busy );
          sqlite3CodeVerifySchema(pParse, iDb);
        }
        goto exit_create_index;
      }
    }
  }else{
    int n;
    Index *pLoop;
    for(pLoop=pTab->pIndex, n=1; pLoop; pLoop=pLoop->pNext, n++){}
    zName = sqlite3MPrintf(db, "sqlite_autoindex_%s_%d", pTab->zName, n);
    if( zName==0 ){
      goto exit_create_index;
    }

    /* Automatic index names generated from within sqlite3_declare_vtab()
    ** must have names that are distinct from normal automatic index names.
    ** The following statement converts "sqlite3_autoindex..." into
    ** "sqlite3_butoindex..." in order to make the names distinct.
    ** The "vtab_err.test" test demonstrates the need of this statement. */
    if( IN_SPECIAL_PARSE ) zName[7]++;
  }

  /* Check for authorization to create an index.
  */
#ifndef SQLITE_OMIT_AUTHORIZATION
  if( !IN_RENAME_OBJECT ){
    const char *zDb = pDb->zDbSName;
    if( sqlite3AuthCheck(pParse, SQLITE_INSERT, SCHEMA_TABLE(iDb), 0, zDb) ){
      goto exit_create_index;
    }
    i = SQLITE_CREATE_INDEX;
    if( !OMIT_TEMPDB && iDb==1 ) i = SQLITE_CREATE_TEMP_INDEX;
    if( sqlite3AuthCheck(pParse, i, zName, pTab->zName, zDb) ){
      goto exit_create_index;
    }
  }
#endif

  /* If pList==0, it means this routine was called to make a primary
  ** key out of the last column added to the table under construction.
  ** So create a fake list to simulate this.
  */
  if( pList==0 ){
    Token prevCol;
    Column *pCol = &pTab->aCol[pTab->nCol-1];
    pCol->colFlags |= COLFLAG_UNIQUE;
    sqlite3TokenInit(&prevCol, pCol->zName);
    pList = sqlite3ExprListAppend(pParse, 0,
              sqlite3ExprAlloc(db, TK_ID, &prevCol, 0));
    if( pList==0 ) goto exit_create_index;
    assert( pList->nExpr==1 );
    sqlite3ExprListSetSortOrder(pList, sortOrder);
  }else{
    sqlite3ExprListCheckLength(pParse, pList, "index");
    if( pParse->nErr ) goto exit_create_index;
  }

  /* Figure out how many bytes of space are required to store explicitly
  ** specified collation sequence names.
  */
  for(i=0; i<pList->nExpr; i++){
    Expr *pExpr = pList->a[i].pExpr;
    assert( pExpr!=0 );
    if( pExpr->op==TK_COLLATE ){
      nExtra += (1 + sqlite3Strlen30(pExpr->u.zToken));
    }
  }

  /* 
  ** Allocate the index structure. 
  */
  nName = sqlite3Strlen30(zName);
  nExtraCol = pPk ? pPk->nKeyCol : 1;
  assert( pList->nExpr + nExtraCol <= 32767 /* Fits in i16 */ );
  pIndex = sqlite3AllocateIndexObject(db, pList->nExpr + nExtraCol,
                                      nName + nExtra + 1, &zExtra);
  if( db->mallocFailed ){
    goto exit_create_index;
  }
  assert( EIGHT_BYTE_ALIGNMENT(pIndex->aiRowLogEst) );
  assert( EIGHT_BYTE_ALIGNMENT(pIndex->azColl) );
  pIndex->zName = zExtra;
  zExtra += nName + 1;
  memcpy(pIndex->zName, zName, nName+1);
  pIndex->pTable = pTab;
  pIndex->onError = (u8)onError;
  pIndex->uniqNotNull = onError!=OE_None;
  pIndex->idxType = idxType;
  pIndex->pSchema = db->aDb[iDb].pSchema;
  pIndex->nKeyCol = pList->nExpr;
  if( pPIWhere ){
    sqlite3ResolveSelfReference(pParse, pTab, NC_PartIdx, pPIWhere, 0);
    pIndex->pPartIdxWhere = pPIWhere;
    pPIWhere = 0;
  }
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );

  /* Check to see if we should honor DESC requests on index columns
  */
  if( pDb->pSchema->file_format>=4 ){
    sortOrderMask = -1;   /* Honor DESC */
  }else{
    sortOrderMask = 0;    /* Ignore DESC */
  }

  /* Analyze the list of expressions that form the terms of the index and
  ** report any errors.  In the common case where the expression is exactly
  ** a table column, store that column in aiColumn[].  For general expressions,
  ** populate pIndex->aColExpr and store XN_EXPR (-2) in aiColumn[].
  **
  ** TODO: Issue a warning if two or more columns of the index are identical.
  ** TODO: Issue a warning if the table primary key is used as part of the
  ** index key.
  */
  pListItem = pList->a;
  if( IN_RENAME_OBJECT ){
    pIndex->aColExpr = pList;
    pList = 0;
  }
  for(i=0; i<pIndex->nKeyCol; i++, pListItem++){
    Expr *pCExpr;                  /* The i-th index expression */
    int requestedSortOrder;        /* ASC or DESC on the i-th expression */
    const char *zColl;             /* Collation sequence name */

    sqlite3StringToId(pListItem->pExpr);
    sqlite3ResolveSelfReference(pParse, pTab, NC_IdxExpr, pListItem->pExpr, 0);
    if( pParse->nErr ) goto exit_create_index;
    pCExpr = sqlite3ExprSkipCollate(pListItem->pExpr);
    if( pCExpr->op!=TK_COLUMN ){
      if( pTab==pParse->pNewTable ){
        sqlite3ErrorMsg(pParse, "expressions prohibited in PRIMARY KEY and "
                                "UNIQUE constraints");
        goto exit_create_index;
      }
      if( pIndex->aColExpr==0 ){
        pIndex->aColExpr = pList;
        pList = 0;
      }
      j = XN_EXPR;
      pIndex->aiColumn[i] = XN_EXPR;
      pIndex->uniqNotNull = 0;
    }else{
      j = pCExpr->iColumn;
      assert( j<=0x7fff );
      if( j<0 ){
        j = pTab->iPKey;
      }else if( pTab->aCol[j].notNull==0 ){
        pIndex->uniqNotNull = 0;
      }
      pIndex->aiColumn[i] = (i16)j;
    }
    zColl = 0;
    if( pListItem->pExpr->op==TK_COLLATE ){
      int nColl;
      zColl = pListItem->pExpr->u.zToken;
      nColl = sqlite3Strlen30(zColl) + 1;
      assert( nExtra>=nColl );
      memcpy(zExtra, zColl, nColl);
      zColl = zExtra;
      zExtra += nColl;
      nExtra -= nColl;
    }else if( j>=0 ){
      zColl = pTab->aCol[j].zColl;
    }
    if( !zColl ) zColl = sqlite3StrBINARY;
    if( !db->init.busy && !sqlite3LocateCollSeq(pParse, zColl) ){
      goto exit_create_index;
    }
    pIndex->azColl[i] = zColl;
    requestedSortOrder = pListItem->sortOrder & sortOrderMask;
    pIndex->aSortOrder[i] = (u8)requestedSortOrder;
  }

  /* Append the table key to the end of the index.  For WITHOUT ROWID
  ** tables (when pPk!=0) this will be the declared PRIMARY KEY.  For
  ** normal tables (when pPk==0) this will be the rowid.
  */
  if( pPk ){
    for(j=0; j<pPk->nKeyCol; j++){
      int x = pPk->aiColumn[j];
      assert( x>=0 );
      if( hasColumn(pIndex->aiColumn, pIndex->nKeyCol, x) ){
        pIndex->nColumn--; 
      }else{
        pIndex->aiColumn[i] = x;
        pIndex->azColl[i] = pPk->azColl[j];
        pIndex->aSortOrder[i] = pPk->aSortOrder[j];
        i++;
      }
    }
    assert( i==pIndex->nColumn );
  }else{
    pIndex->aiColumn[i] = XN_ROWID;
    pIndex->azColl[i] = sqlite3StrBINARY;
  }
  sqlite3DefaultRowEst(pIndex);
  if( pParse->pNewTable==0 ) estimateIndexWidth(pIndex);

  /* If this index contains every column of its table, then mark
  ** it as a covering index */
  assert( HasRowid(pTab) 
      || pTab->iPKey<0 || sqlite3ColumnOfIndex(pIndex, pTab->iPKey)>=0 );
  recomputeColumnsNotIndexed(pIndex);
  if( pTblName!=0 && pIndex->nColumn>=pTab->nCol ){
    pIndex->isCovering = 1;
    for(j=0; j<pTab->nCol; j++){
      if( j==pTab->iPKey ) continue;
      if( sqlite3ColumnOfIndex(pIndex,j)>=0 ) continue;
      pIndex->isCovering = 0;
      break;
    }
  }

  if( pTab==pParse->pNewTable ){
    /* This routine has been called to create an automatic index as a
    ** result of a PRIMARY KEY or UNIQUE clause on a column definition, or
    ** a PRIMARY KEY or UNIQUE clause following the column definitions.
    ** i.e. one of:
    **
    ** CREATE TABLE t(x PRIMARY KEY, y);
    ** CREATE TABLE t(x, y, UNIQUE(x, y));
    **
    ** Either way, check to see if the table already has such an index. If
    ** so, don't bother creating this one. This only applies to
    ** automatically created indices. Users can do as they wish with
    ** explicit indices.
    **
    ** Two UNIQUE or PRIMARY KEY constraints are considered equivalent
    ** (and thus suppressing the second one) even if they have different
    ** sort orders.
    **
    ** If there are different collating sequences or if the columns of
    ** the constraint occur in different orders, then the constraints are
    ** considered distinct and both result in separate indices.
    */
    Index *pIdx;
    for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
      int k;
      assert( IsUniqueIndex(pIdx) );
      assert( pIdx->idxType!=SQLITE_IDXTYPE_APPDEF );
      assert( IsUniqueIndex(pIndex) );

      if( pIdx->nKeyCol!=pIndex->nKeyCol ) continue;
      for(k=0; k<pIdx->nKeyCol; k++){
        const char *z1;
        const char *z2;
        assert( pIdx->aiColumn[k]>=0 );
        if( pIdx->aiColumn[k]!=pIndex->aiColumn[k] ) break;
        z1 = pIdx->azColl[k];
        z2 = pIndex->azColl[k];
        if( sqlite3StrICmp(z1, z2) ) break;
      }
      if( k==pIdx->nKeyCol ){
        if( pIdx->onError!=pIndex->onError ){
          /* This constraint creates the same index as a previous
          ** constraint specified somewhere in the CREATE TABLE statement.
          ** However the ON CONFLICT clauses are different. If both this 
          ** constraint and the previous equivalent constraint have explicit
          ** ON CONFLICT clauses this is an error. Otherwise, use the
          ** explicitly specified behavior for the index.
          */
          if( !(pIdx->onError==OE_Default || pIndex->onError==OE_Default) ){
            sqlite3ErrorMsg(pParse, 
                "conflicting ON CONFLICT clauses specified", 0);
          }
          if( pIdx->onError==OE_Default ){
            pIdx->onError = pIndex->onError;
          }
        }
        if( idxType==SQLITE_IDXTYPE_PRIMARYKEY ) pIdx->idxType = idxType;
        if( IN_RENAME_OBJECT ){
          pIndex->pNext = pParse->pNewIndex;
          pParse->pNewIndex = pIndex;
          pIndex = 0;
        }
        goto exit_create_index;
      }
    }
  }

  if( !IN_RENAME_OBJECT ){

    /* Link the new Index structure to its table and to the other
    ** in-memory database structures. 
    */
    assert( pParse->nErr==0 );
    if( db->init.busy ){
      Index *p;
      assert( !IN_SPECIAL_PARSE );
      assert( sqlite3SchemaMutexHeld(db, 0, pIndex->pSchema) );
      if( pTblName!=0 ){
        pIndex->tnum = db->init.newTnum;
        if( sqlite3IndexHasDuplicateRootPage(pIndex) ){
          sqlite3ErrorMsg(pParse, "invalid rootpage");
          pParse->rc = SQLITE_CORRUPT_BKPT;
          goto exit_create_index;
        }
      }
      p = sqlite3HashInsert(&pIndex->pSchema->idxHash, 
          pIndex->zName, pIndex);
      if( p ){
        assert( p==pIndex );  /* Malloc must have failed */
        sqlite3OomFault(db);
        goto exit_create_index;
      }
      db->mDbFlags |= DBFLAG_SchemaChange;
    }

    /* If this is the initial CREATE INDEX statement (or CREATE TABLE if the
    ** index is an implied index for a UNIQUE or PRIMARY KEY constraint) then
    ** emit code to allocate the index rootpage on disk and make an entry for
    ** the index in the sqlite_master table and populate the index with
    ** content.  But, do not do this if we are simply reading the sqlite_master
    ** table to parse the schema, or if this index is the PRIMARY KEY index
    ** of a WITHOUT ROWID table.
    **
    ** If pTblName==0 it means this index is generated as an implied PRIMARY KEY
    ** or UNIQUE index in a CREATE TABLE statement.  Since the table
    ** has just been created, it contains no data and the index initialization
    ** step can be skipped.
    */
    else if( HasRowid(pTab) || pTblName!=0 ){
      Vdbe *v;
      char *zStmt;
      int iMem = ++pParse->nMem;

      v = sqlite3GetVdbe(pParse);
      if( v==0 ) goto exit_create_index;

      sqlite3BeginWriteOperation(pParse, 1, iDb);

      /* Create the rootpage for the index using CreateIndex. But before
      ** doing so, code a Noop instruction and store its address in 
      ** Index.tnum. This is required in case this index is actually a 
      ** PRIMARY KEY and the table is actually a WITHOUT ROWID table. In 
      ** that case the convertToWithoutRowidTable() routine will replace
      ** the Noop with a Goto to jump over the VDBE code generated below. */
      pIndex->tnum = sqlite3VdbeAddOp0(v, OP_Noop);
      sqlite3VdbeAddOp3(v, OP_CreateBtree, iDb, iMem, BTREE_BLOBKEY);

      /* Gather the complete text of the CREATE INDEX statement into
      ** the zStmt variable
      */
      if( pStart ){
        int n = (int)(pParse->sLastToken.z - pName->z) + pParse->sLastToken.n;
        if( pName->z[n-1]==';' ) n--;
        /* A named index with an explicit CREATE INDEX statement */
        zStmt = sqlite3MPrintf(db, "CREATE%s INDEX %.*s",
            onError==OE_None ? "" : " UNIQUE", n, pName->z);
      }else{
        /* An automatic index created by a PRIMARY KEY or UNIQUE constraint */
        /* zStmt = sqlite3MPrintf(""); */
        zStmt = 0;
      }

      /* Add an entry in sqlite_master for this index
      */
      sqlite3NestedParse(pParse, 
          "INSERT INTO %Q.%s VALUES('index',%Q,%Q,#%d,%Q);",
          db->aDb[iDb].zDbSName, MASTER_NAME,
          pIndex->zName,
          pTab->zName,
          iMem,
          zStmt
          );
      sqlite3DbFree(db, zStmt);

      /* Fill the index with data and reparse the schema. Code an OP_Expire
      ** to invalidate all pre-compiled statements.
      */
      if( pTblName ){
        sqlite3RefillIndex(pParse, pIndex, iMem);
        sqlite3ChangeCookie(pParse, iDb);
        sqlite3VdbeAddParseSchemaOp(v, iDb,
            sqlite3MPrintf(db, "name='%q' AND type='index'", pIndex->zName));
        sqlite3VdbeAddOp2(v, OP_Expire, 0, 1);
      }

      sqlite3VdbeJumpHere(v, pIndex->tnum);
    }
  }

  /* When adding an index to the list of indices for a table, make
  ** sure all indices labeled OE_Replace come after all those labeled
  ** OE_Ignore.  This is necessary for the correct constraint check
  ** processing (in sqlite3GenerateConstraintChecks()) as part of
  ** UPDATE and INSERT statements.  
  */
  if( db->init.busy || pTblName==0 ){
    if( onError!=OE_Replace || pTab->pIndex==0
         || pTab->pIndex->onError==OE_Replace){
      pIndex->pNext = pTab->pIndex;
      pTab->pIndex = pIndex;
    }else{
      Index *pOther = pTab->pIndex;
      while( pOther->pNext && pOther->pNext->onError!=OE_Replace ){
        pOther = pOther->pNext;
      }
      pIndex->pNext = pOther->pNext;
      pOther->pNext = pIndex;
    }
    pIndex = 0;
  }
  else if( IN_RENAME_OBJECT ){
    assert( pParse->pNewIndex==0 );
    pParse->pNewIndex = pIndex;
    pIndex = 0;
  }

  /* Clean up before exiting */
exit_create_index:
  if( pIndex ) sqlite3FreeIndex(db, pIndex);
  sqlite3ExprDelete(db, pPIWhere);
  sqlite3ExprListDelete(db, pList);
  sqlite3SrcListDelete(db, pTblName);
  sqlite3DbFree(db, zName);
}